

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ParseMagicHeader(AsciiParser *this)

{
  StreamReader *pSVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  bool bVar5;
  ostream *poVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  _Alloc_hider _Var10;
  size_t nbytes;
  size_t sVar11;
  char ver [3];
  char magic [6];
  ostringstream ss_e;
  undefined2 local_1fb;
  char local_1f9;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  bVar5 = SkipWhitespace(this);
  if (!bVar5) {
    return false;
  }
  pSVar1 = this->_sr;
  uVar2 = pSVar1->length_;
  uVar3 = pSVar1->idx_;
  if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
    return false;
  }
  if (pSVar1->binary_[uVar3] == '\0') {
    return false;
  }
  sVar11 = 6;
  if (uVar2 < uVar3 + 6) {
    sVar11 = uVar2 - uVar3;
  }
  if (5 < sVar11 - 1) {
    return false;
  }
  memcpy(&local_1d8,pSVar1->binary_ + uVar3,sVar11);
  pSVar1->idx_ = uVar3 + sVar11;
  if (sVar11 == 0) {
    return false;
  }
  if ((((((char)local_1d8._M_dataplus._M_p == '#') && (local_1d8._M_dataplus._M_p._1_1_ == 'u')) &&
       (local_1d8._M_dataplus._M_p._2_1_ == 's')) &&
      ((local_1d8._M_dataplus._M_p._3_1_ == 'd' && (local_1d8._M_dataplus._M_p._4_1_ == 'a')))) &&
     (local_1d8._M_dataplus._M_p._5_1_ == ' ')) {
    bVar5 = SkipWhitespace(this);
    if (!bVar5) {
      return false;
    }
    pSVar1 = this->_sr;
    uVar4 = pSVar1->idx_;
    sVar11 = 3;
    if (pSVar1->length_ < uVar4 + 3) {
      sVar11 = pSVar1->length_ - uVar4;
    }
    if (2 < sVar11 - 1) {
      return false;
    }
    memcpy(&local_1fb,pSVar1->binary_ + uVar4,sVar11);
    pSVar1->idx_ = uVar4 + sVar11;
    if (sVar11 == 0) {
      return false;
    }
    if ((((char)local_1fb == '1') && (local_1fb._1_1_ == '.')) && (local_1f9 == '0')) {
      this->_version = 1.0;
      SkipUntilNewline(this);
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"ParseMagicHeader",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(local_198,0x92f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    local_1d8.field_2._M_allocated_capacity._0_2_ = local_1fb;
    local_1d8.field_2._M_local_buf[2] = local_1f9;
    local_1d8._M_string_length = 3;
    local_1d8.field_2._M_local_buf[3] = '\0';
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    ::std::operator+(&local_1b8,"Version must be `1.0` but got `",&local_1d8);
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_1b8);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_1f8.field_2._M_allocated_capacity = *psVar8;
      local_1f8.field_2._8_8_ = plVar7[3];
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar8;
      local_1f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,
                      CONCAT17(local_1b8.field_2._M_local_buf[7],
                               CONCAT16(local_1b8.field_2._M_local_buf[6],
                                        CONCAT24(local_1b8.field_2._M_allocated_capacity._4_2_,
                                                 local_1b8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_0034644c;
    lVar9 = CONCAT44(local_1d8.field_2._M_allocated_capacity._4_4_,
                     CONCAT13(local_1d8.field_2._M_local_buf[3],
                              CONCAT12(local_1d8.field_2._M_local_buf[2],
                                       local_1d8.field_2._M_allocated_capacity._0_2_)));
    _Var10._M_p = local_1d8._M_dataplus._M_p;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"ParseMagicHeader",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(local_198,0x91a);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    local_1b8.field_2._M_allocated_capacity._0_4_ = local_1d8._M_dataplus._M_p._0_4_;
    local_1b8.field_2._M_allocated_capacity._4_2_ = local_1d8._M_dataplus._M_p._4_2_;
    local_1b8._M_string_length = 6;
    local_1b8.field_2._M_local_buf[6] = '\0';
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x3c8b4e);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_1f8.field_2._M_allocated_capacity = *psVar8;
      local_1f8.field_2._8_8_ = plVar7[3];
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar8;
      local_1f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) goto LAB_0034644c;
    lVar9 = CONCAT17(local_1b8.field_2._M_local_buf[7],
                     CONCAT16(local_1b8.field_2._M_local_buf[6],
                              CONCAT24(local_1b8.field_2._M_allocated_capacity._4_2_,
                                       local_1b8.field_2._M_allocated_capacity._0_4_)));
    _Var10._M_p = local_1b8._M_dataplus._M_p;
  }
  operator_delete(_Var10._M_p,lVar9 + 1);
LAB_0034644c:
  ::std::__cxx11::stringbuf::str();
  PushError(this,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_198);
  ::std::ios_base::~ios_base(local_128);
  return false;
}

Assistant:

bool AsciiParser::ParseMagicHeader() {
  if (!SkipWhitespace()) {
    return false;
  }

  if (Eof()) {
    return false;
  }

  {
    char magic[6];
    if (!_sr->read(6, 6, reinterpret_cast<uint8_t *>(magic))) {
      // eol
      return false;
    }

    if ((magic[0] == '#') && (magic[1] == 'u') && (magic[2] == 's') &&
        (magic[3] == 'd') && (magic[4] == 'a') && (magic[5] == ' ')) {
      // ok
    } else {
      PUSH_ERROR_AND_RETURN(
          "Magic header must start with `#usda `(at least single whitespace "
          "after 'a') but got `" +
          std::string(magic, 6));
    }
  }

  if (!SkipWhitespace()) {
    // eof
    return false;
  }

  // current we only accept "1.0"
  {
    char ver[3];
    if (!_sr->read(3, 3, reinterpret_cast<uint8_t *>(ver))) {
      return false;
    }

    if ((ver[0] == '1') && (ver[1] == '.') && (ver[2] == '0')) {
      // ok
      _version = 1.0f;
    } else {
      PUSH_ERROR_AND_RETURN("Version must be `1.0` but got `" +
                            std::string(ver, 3) + "`");
    }
  }

  SkipUntilNewline();

  return true;
}